

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterSystem.cpp
# Opt level: O3

void __thiscall
Sega::MasterSystem::ConcreteMachine<(Analyser::Static::Sega::Target::Model)2>::ConcreteMachine
          (ConcreteMachine<(Analyser::Static::Sega::Target::Model)2> *this,Target *target,
          ROMFetcher *rom_fetcher)

{
  AsyncTaskQueue<false,_true,_void> *this_00;
  OPLL *this_01;
  CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL> *this_02;
  uint8_t *puVar1;
  _Rb_tree_color _Var2;
  pointer psVar3;
  PagingScheme PVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  Joystick *pJVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  long lVar9;
  _Base_ptr p_Var10;
  size_t __n;
  ulong uVar11;
  Name name;
  undefined1 auVar12 [16];
  ulong uVar13;
  initializer_list<Inputs::Keyboard::Key> __l;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  allocator_type local_e2;
  less<Inputs::Keyboard::Key> local_e1;
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  *local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d8;
  Keyboard *local_d0;
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>,_false>
  *local_c8;
  CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL> *local_c0;
  OPLL *local_b8;
  AsyncTaskQueue<false,_true,_void> *local_b0;
  Processor<Sega::MasterSystem::ConcreteMachine<(Analyser::Static::Sega::Target::Model)2>,_false,_false>
  *local_a8;
  double local_a0;
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_98;
  undefined1 local_68 [24];
  pointer local_50;
  pointer local_48;
  size_t local_40;
  Key local_38 [2];
  
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0059b838;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0059b8c0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0059b908;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0059b940;
  (this->super_KeyboardMachine).super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0059b958;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_0059b998;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0059b9b0;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&PTR_keyboard_did_change_key_0059b9d0;
  PVar4 = target->paging_scheme;
  this->region_ = target->region;
  this->paging_scheme_ = PVar4;
  local_a8 = &this->z80_;
  CPU::Z80::
  Processor<Sega::MasterSystem::ConcreteMachine<(Analyser::Static::Sega::Target::Model)2>,_false,_false>
  ::Processor(local_a8,this);
  (this->vdp_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_0059bad0;
  TI::TMS::TMS9918<(TI::TMS::Personality)4>::TMS9918(&(this->vdp_).object_);
  (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->vdp_).time_until_event_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->vdp_).time_overrun_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->vdp_).is_flushed_ = true;
  (this->vdp_).did_flush_ = false;
  (this->vdp_).clocking_preference_ = JustInTime;
  (this->vdp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
  this_00 = &this->audio_queue_;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(this_00);
  local_b0 = this_00;
  TI::SN76489::SN76489(&this->sn76489_,(uint)(target->model != SG1000) * 2,this_00,1);
  this_01 = &this->opll_;
  Yamaha::OPL::OPLL::OPLL(this_01,this_00,1,false);
  this_02 = &this->mixer_;
  local_b8 = this_01;
  Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>::CompoundSource
            (this_02,&this->sn76489_,this_01);
  local_c8 = &(this->speaker_).
              super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>,_false>
  ;
  local_c0 = this_02;
  Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>::
  PullLowpass((PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_> *)
              local_c8,this_02);
  this->opll_detection_word_ = 0xff;
  local_e0 = (vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
              *)&this->joysticks_;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38[0] = Enter;
  local_38[1] = Escape;
  __l._M_len = 2;
  __l._M_array = local_38;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set((set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
         *)&local_98,__l,&local_e1,&local_e2);
  local_d0 = &this->keyboard_;
  local_50 = (pointer)(local_68 + 8);
  local_68._0_8_ = 0;
  local_68._8_8_ = 0;
  local_68._16_8_ = (pointer)0x0;
  local_40 = 0;
  local_48 = local_50;
  Inputs::Keyboard::Keyboard
            (local_d0,(set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
                       *)&local_98,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)local_68);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)local_68);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree(&local_98);
  this->reset_is_pressed_ = false;
  this->pause_is_pressed_ = false;
  (this->cartridge_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cartridge_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cartridge_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->time_since_sn76489_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->time_until_debounce_).super_WrappedInt<HalfCycles>.length_ = 0;
  this->io_port_control_ = '\x0f';
  this->paging_registers_[0] = '\0';
  this->paging_registers_[1] = '\x01';
  this->paging_registers_[2] = '\x02';
  this->memory_control_ = '\0';
  this->has_bios_ = true;
  local_a0 = *(double *)(&DAT_004c8d30 + (ulong)(target->region == Europe) * 8);
  local_d8 = &this->cartridge_;
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_Yamaha::OPL::OPLL>_>,_false>
  ::set_input_rate(local_c8,(float)local_a0);
  (this->super_TimedMachine).clock_rate_ = local_a0;
  pJVar6 = (Joystick *)operator_new(0x48);
  MasterSystem::Joystick::Joystick(pJVar6);
  local_98._M_impl._0_8_ = pJVar6;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<Sega::MasterSystem::Joystick*>(local_e0,(Joystick **)&local_98);
  pJVar6 = (Joystick *)operator_new(0x48);
  MasterSystem::Joystick::Joystick(pJVar6);
  local_98._M_impl._0_8_ = pJVar6;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<Sega::MasterSystem::Joystick*>(local_e0,(Joystick **)&local_98);
  memset(this->read_pointers_,0,0x400);
  psVar3 = (target->super_Target).media.cartridges.
           super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar3 != (target->super_Target).media.cartridges.
                super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->cartridge_,
               &((((psVar3->
                   super___shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->segments_).
                 super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
                 ._M_impl.super__Vector_impl_data._M_start)->data);
  }
  pvVar5 = local_d8;
  uVar11 = (long)(this->cartridge_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->cartridge_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar11 < 0xc000) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_d8,0xc000);
    memset((pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + uVar11,0xff,0xc000 - uVar11);
  }
  if (this->paging_scheme_ == Codemasters) {
    this->paging_registers_[0] = '\0';
    this->paging_registers_[1] = '\x01';
    this->paging_registers_[2] = '\0';
  }
  name = MasterSystemWesternBIOS - (target->region == Japan);
  ROM::Request::Request((Request *)local_68,name,true);
  if ((rom_fetcher->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*rom_fetcher->_M_invoker)
            ((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)&local_98,(_Any_data *)rom_fetcher,(Request *)local_68);
  ROM::Request::validate((Request *)local_68,(Map *)&local_98);
  if (local_98._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var8 = (_Base_ptr)((long)&local_98 + 8U);
    do {
      p_Var10 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = p_Var8;
      _Var2 = p_Var10[1]._M_color;
      p_Var8 = p_Var10;
      if ((int)_Var2 < (int)name) {
        p_Var8 = p_Var7;
      }
      local_98._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&p_Var10->_M_left)[(int)_Var2 < (int)name];
    } while ((&p_Var10->_M_left)[(int)_Var2 < (int)name] != (_Base_ptr)0x0);
    if (p_Var8 != (_Base_ptr)((long)&local_98 + 8U)) {
      if ((int)_Var2 < (int)name) {
        p_Var10 = p_Var7;
      }
      if ((int)p_Var10[1]._M_color <= (int)name) {
        this->has_bios_ = true;
        __n = (long)p_Var8[1]._M_left - (long)p_Var8[1]._M_parent;
        if (0x1fff < __n) {
          __n = 0x2000;
        }
        memcpy(this->bios_,p_Var8[1]._M_parent,__n);
        goto LAB_0035a437;
      }
    }
  }
  this->has_bios_ = false;
  this->memory_control_ = this->memory_control_ | 8;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"No BIOS found; attempting to start cartridge directly",0x35);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
LAB_0035a437:
  page_cartridge(this);
  puVar1 = this->ram_;
  uVar11 = 0;
  uVar13 = 0xc400;
  lVar9 = 0x59d5;
  auVar12._8_4_ = (int)puVar1;
  auVar12._0_8_ = puVar1;
  auVar12._12_4_ = (int)((ulong)puVar1 >> 0x20);
  do {
    (&this->super_Machine)[lVar9]._vptr_Machine = (_func_int **)(puVar1 + (uVar11 & 0x1c00));
    ((TimedMachine *)(&this->super_Machine + lVar9 + 1))->_vptr_TimedMachine =
         (_func_int **)((uVar13 & 0x1c00) + auVar12._8_8_);
    uVar11 = uVar11 + 0x800;
    uVar13 = uVar13 + 0x800;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 0x59e5);
  uVar11 = 0;
  uVar13 = 0xc400;
  lVar9 = 0x5a15;
  do {
    (&this->super_Machine)[lVar9]._vptr_Machine = (_func_int **)(puVar1 + (uVar11 & 0x1c00));
    ((TimedMachine *)(&this->super_Machine + lVar9 + 1))->_vptr_TimedMachine =
         (_func_int **)((uVar13 & 0x1c00) + auVar12._8_8_);
    uVar11 = uVar11 + 0x800;
    uVar13 = uVar13 + 0x800;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 0x5a25);
  set_mixer_levels(this,'\0');
  Inputs::Keyboard::set_delegate(local_d0,&this->super_Delegate);
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&local_98);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)(local_68 + 0x10));
  return;
}

Assistant:

ConcreteMachine(const Analyser::Static::Sega::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			region_(target.region),
			paging_scheme_(target.paging_scheme),
			z80_(*this),
			sn76489_(
				(target.model == Target::Model::SG1000) ? TI::SN76489::Personality::SN76489 : TI::SN76489::Personality::SMS,
				audio_queue_,
				audio_divider),
			opll_(audio_queue_, audio_divider),
			mixer_(sn76489_, opll_),
			speaker_(mixer_),
			keyboard_({Inputs::Keyboard::Key::Enter, Inputs::Keyboard::Key::Escape}, {}) {
			// Pick the clock rate based on the region.
			const double clock_rate = target.region == Target::Region::Europe ? 3546893.0 : 3579540.0;
			speaker_.set_input_rate(float(clock_rate / audio_divider));
			set_clock_rate(clock_rate);

			// Instantiate the joysticks.
			joysticks_.emplace_back(new Joystick);
			joysticks_.emplace_back(new Joystick);

			// Clear the memory map.
			map(read_pointers_, nullptr, 0x10000, 0);
			map(write_pointers_, nullptr, 0x10000, 0);

			// Take a copy of the cartridge and place it into memory.
			if(!target.media.cartridges.empty()) {
				cartridge_ = target.media.cartridges[0]->get_segments()[0].data;
			}
			if(cartridge_.size() < 48*1024) {
				std::size_t new_space = 48*1024 - cartridge_.size();
				cartridge_.resize(48*1024);
				memset(&cartridge_[48*1024 - new_space], 0xff, new_space);
			}

			if(paging_scheme_ == Target::PagingScheme::Codemasters) {
				// The Codemasters cartridges start with pages 0, 1 and 0 again initially visible.
				paging_registers_[0] = 0;
				paging_registers_[1] = 1;
				paging_registers_[2] = 0;
			}

			// Load the BIOS if available.
			//
			// TODO: there's probably a million other versions of the Master System BIOS; try to build a
			// CRC32 catalogue of those. So far:
			//
			//	0072ed54 = US/European BIOS 1.3
			//	48d44a13 = Japanese BIOS 2.1
			const bool is_japanese = target.region == Target::Region::Japan;
			const ROM::Name bios_name = is_japanese ? ROM::Name::MasterSystemJapaneseBIOS : ROM::Name::MasterSystemWesternBIOS;
			ROM::Request request(bios_name, true);
			auto roms = rom_fetcher(request);
			request.validate(roms);

			const auto rom = roms.find(bios_name);
			if(rom == roms.end()) {
				// No BIOS found; attempt to boot as though it has already disabled itself.
				has_bios_ = false;
				memory_control_ |= 0x08;
				std::cerr << "No BIOS found; attempting to start cartridge directly" << std::endl;
			} else {
				has_bios_ = true;
				memcpy(&bios_, rom->second.data(), std::min(sizeof(bios_), rom->second.size()));
			}
			page_cartridge();

			// Map RAM.
			if constexpr (is_master_system(model)) {
				map(read_pointers_, ram_, 8*1024, 0xc000, 0x10000);
				map(write_pointers_, ram_, 8*1024, 0xc000, 0x10000);
			} else {
				map(read_pointers_, ram_, 1024, 0xc000, 0x10000);
				map(write_pointers_, ram_, 1024, 0xc000, 0x10000);
			}

			// Apply a relatively low low-pass filter. More guidance needed here.
			// TODO: this is disabled for now since it isn't applicable for the FM chip, I think.
//			speaker_.set_high_frequency_cutoff(8000);

			// Set default mixer levels: FM off, SN full-throttle.
			set_mixer_levels(0);

			keyboard_.set_delegate(this);
		}